

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O0

int __thiscall IInput::CursorRelative(IInput *this,float *pX,float *pY)

{
  ulong uVar1;
  long *plVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  IJoystick *pJoystick;
  int local_4;
  
  uVar1 = (**(code **)(*in_RDI + 0x60))(in_RDI,in_RSI,in_RDX);
  if ((uVar1 & 1) == 0) {
    plVar2 = (long *)(**(code **)(*in_RDI + 0x38))();
    if ((plVar2 == (long *)0x0) ||
       (uVar1 = (**(code **)(*plVar2 + 0x40))(plVar2,in_RSI,in_RDX), (uVar1 & 1) == 0)) {
      local_4 = 0;
    }
    else {
      local_4 = 2;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CursorRelative(float *pX, float *pY)
	{
		if(MouseRelative(pX, pY))
			return CURSOR_MOUSE;
		IJoystick *pJoystick = GetActiveJoystick();
		if(pJoystick && pJoystick->Relative(pX, pY))
			return CURSOR_JOYSTICK;
		return CURSOR_NONE;
	}